

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O0

void __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::_runControlDependenceAnalysis
          (LLVMDependenceGraphBuilder *this)

{
  LLVMControlDependenceAnalysisOptions *pLVar1;
  uint64_t uVar2;
  LLVMDependenceGraphBuilder *in_RDI;
  
  _timerStart(in_RDI);
  pLVar1 = (LLVMControlDependenceAnalysisOptions *)
           std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
           operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                       *)0x1ab1a9);
  dg::LLVMDependenceGraph::computeControlDependencies(pLVar1);
  uVar2 = _timerEnd(in_RDI);
  (in_RDI->_statistics).cdaTime = uVar2;
  return;
}

Assistant:

void _runControlDependenceAnalysis() {
        _timerStart();
        //_CDA->run();
        // FIXME: until we get rid of the legacy code,
        // use the old way of inserting CD edges directly
        // into the dg
        _dg->computeControlDependencies(_options.CDAOptions);
        _statistics.cdaTime = _timerEnd();
    }